

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall TApp_RequiredSubCom_Test::TestBody(TApp_RequiredSubCom_Test *this)

{
  App *this_00;
  bool bVar1;
  AssertHelper local_c0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8 [4];
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"sub1",(allocator *)local_b8);
  std::__cxx11::string::string((string *)&local_58,"",(allocator *)&local_c0);
  this_00 = &(this->super_TApp).app;
  CLI::App::add_subcommand(this_00,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_78,"sub2",(allocator *)local_b8);
  std::__cxx11::string::string((string *)&local_98,"",(allocator *)&local_c0);
  CLI::App::add_subcommand(this_00,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  (this->super_TApp).app.require_subcommand_min_ = 1;
  (this->super_TApp).app.require_subcommand_max_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_b8);
  testing::internal::AssertHelper::AssertHelper
            (&local_c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x14c,
             "Expected: run() throws an exception of type CLI::RequiredError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
  testing::internal::AssertHelper::~AssertHelper(&local_c0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_b8);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_b8,"sub1",(allocator *)&local_c0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,local_b8,&local_98);
  std::__cxx11::string::~string((string *)local_b8);
  TApp::run(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, RequiredSubCom) {
    app.add_subcommand("sub1");
    app.add_subcommand("sub2");

    app.require_subcommand();

    EXPECT_THROW(run(), CLI::RequiredError);

    app.reset();

    args = {"sub1"};

    run();
}